

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::ValueImpl<true>::ValueImpl<unsigned_long,void>
          (ValueImpl<true> *this,unsigned_long *value)

{
  bool bVar1;
  AlphaNum local_48;
  unsigned_long *local_18;
  unsigned_long *value_local;
  ValueImpl<true> *this_local;
  
  local_18 = value;
  value_local = (unsigned_long *)this;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_48,*value);
  ToStringOrCallback_abi_cxx11_(this,this,&local_48);
  std::__cxx11::string::string((string *)&this->consume_after);
  this->consume_parens_if_empty = false;
  bVar1 = std::holds_alternative<std::function<bool()>,std::__cxx11::string,std::function<bool()>>
                    (&this->value);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->consume_after,";,");
  }
  return;
}

Assistant:

ValueImpl(Value&& value)  // NOLINT
      : value(ToStringOrCallback(std::forward<Value>(value), Rank2{})) {
    if (std::holds_alternative<Callback>(this->value)) {
      consume_after = ";,";
    }
  }